

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

size_t Imf_2_5::bytesPerLineTable
                 (Header *header,vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine
                 )

{
  bool bVar1;
  int iVar2;
  Box2i *pBVar3;
  ulong uVar4;
  Channel *pCVar5;
  reference pvVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  int i_1;
  int y_1;
  size_t maxBytesPerLine;
  int i;
  int y;
  size_t nBytes;
  ConstIterator c;
  ChannelList *channels;
  Box2i *dataWindow;
  ChannelList *in_stack_ffffffffffffff88;
  ConstIterator *in_stack_ffffffffffffff90;
  value_type vVar7;
  size_type in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar8;
  undefined4 in_stack_ffffffffffffffb4;
  value_type local_48;
  int local_40;
  int local_3c;
  
  pBVar3 = Header::dataWindow((Header *)0x284b48);
  Header::channels((Header *)0x284b57);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  ChannelList::begin(in_stack_ffffffffffffff88);
  while( true ) {
    ChannelList::end(in_stack_ffffffffffffff88);
    bVar1 = operator!=(in_stack_ffffffffffffff90,(ConstIterator *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    ChannelList::ConstIterator::channel((ConstIterator *)0x284bbc);
    iVar2 = pixelTypeSize((PixelType)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    uVar4 = (long)iVar2 * (long)(((pBVar3->max).x - (pBVar3->min).x) + 1);
    pCVar5 = ChannelList::ConstIterator::channel((ConstIterator *)0x284bed);
    iVar2 = pCVar5->xSampling;
    local_3c = (pBVar3->min).y;
    local_40 = 0;
    for (; local_3c <= (pBVar3->max).y; local_3c = local_3c + 1) {
      ChannelList::ConstIterator::channel((ConstIterator *)0x284c37);
      iVar8 = Imath_2_5::modp((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                              (int)in_stack_ffffffffffffff90);
      if (iVar8 == 0) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RSI,(long)local_40);
        *pvVar6 = uVar4 / (ulong)(long)iVar2 + *pvVar6;
      }
      local_40 = local_40 + 1;
    }
    ChannelList::ConstIterator::operator++(in_stack_ffffffffffffff90);
  }
  local_48 = 0;
  iVar8 = 0;
  for (iVar2 = (pBVar3->min).y; iVar2 <= (pBVar3->max).y; iVar2 = iVar2 + 1) {
    vVar7 = local_48;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI,(long)iVar8);
    if (vVar7 < *pvVar6) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,(long)iVar8);
      local_48 = *pvVar6;
    }
    iVar8 = iVar8 + 1;
  }
  return local_48;
}

Assistant:

size_t
bytesPerLineTable (const Header &header,
		   vector<size_t> &bytesPerLine)
{
    const Box2i &dataWindow = header.dataWindow();
    const ChannelList &channels = header.channels();

    bytesPerLine.resize (dataWindow.max.y - dataWindow.min.y + 1);

    for (ChannelList::ConstIterator c = channels.begin();
	 c != channels.end();
	 ++c)
    {
	size_t nBytes = size_t(pixelTypeSize (c.channel().type)) *
		     size_t(dataWindow.max.x - dataWindow.min.x + 1) /
		     size_t(c.channel().xSampling);

	for (int y = dataWindow.min.y, i = 0; y <= dataWindow.max.y; ++y, ++i)
	    if (modp (y, c.channel().ySampling) == 0)
		bytesPerLine[i] += nBytes;
    }

    size_t maxBytesPerLine = 0;

    for (int y = dataWindow.min.y, i = 0; y <= dataWindow.max.y; ++y, ++i)
	if (maxBytesPerLine < bytesPerLine[i])
	    maxBytesPerLine = bytesPerLine[i];

    return maxBytesPerLine;
}